

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_quantize_avx2.c
# Opt level: O0

void av1_quantize_fp_32x32_avx2
               (tran_low_t *coeff_ptr,intptr_t n_coeffs,int16_t *zbin_ptr,int16_t *round_ptr,
               int16_t *quant_ptr,int16_t *quant_shift_ptr,tran_low_t *qcoeff_ptr,
               tran_low_t *dqcoeff_ptr,int16_t *dequant_ptr,uint16_t *eob_ptr,int16_t *scan_ptr,
               int16_t *iscan_ptr)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  __m256i eob;
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  uint16_t uVar11;
  long in_RSI;
  undefined8 uVar12;
  undefined8 uVar16;
  undefined1 auVar13 [16];
  undefined8 uVar17;
  undefined8 uVar18;
  undefined1 auVar14 [32];
  undefined1 auVar15 [64];
  long in_stack_00000008;
  __m256i thr;
  __m256i qp [3];
  uint step;
  int log_scale;
  __m256i dq_1;
  __m256i nz_mask_1;
  __m256i abs_dq_1;
  __m256i q_1;
  __m256i abs_q_1;
  __m256i tmp_rnd_1;
  int nzflag_1;
  __m256i mask_1;
  __m256i abs_coeff_1;
  __m256i coeff_1;
  __m256i dq;
  __m256i nz_mask;
  __m256i abs_dq;
  __m256i q;
  __m256i abs_q;
  __m256i tmp_rnd;
  int nzflag;
  __m256i mask;
  __m256i abs_coeff;
  __m256i coeff;
  __m256i v_nz_iscan;
  __m256i v_iscan_plus1;
  __m256i v_iscan_perm;
  __m256i v_iscan;
  __m256i v_nz_iscan_1;
  __m256i v_iscan_plus1_1;
  __m256i v_iscan_perm_1;
  __m256i v_iscan_1;
  undefined1 local_c40 [16];
  tran_low_t *in_stack_fffffffffffff3e0;
  __m256i *in_stack_fffffffffffff3e8;
  __m256i *in_stack_fffffffffffff3f0;
  undefined4 uStack_c08;
  int in_stack_fffffffffffff3fc;
  int16_t *in_stack_fffffffffffff400;
  int16_t *in_stack_fffffffffffff408;
  tran_low_t *in_stack_fffffffffffff410;
  longlong lVar20;
  longlong lVar21;
  __m256i in_stack_fffffffffffff418;
  longlong lVar22;
  undefined8 uStack_bc8;
  undefined8 local_bc0;
  undefined8 uStack_bb8;
  undefined8 uStack_bb0;
  undefined8 uStack_ba8;
  long local_b70;
  ulong uStack_9b8;
  ulong uStack_818;
  undefined1 auVar19 [32];
  
  lVar20 = in_stack_fffffffffffff418[1];
  lVar21 = in_stack_fffffffffffff418[2];
  lVar22 = in_stack_fffffffffffff418[3];
  uVar12 = 0;
  uVar16 = 0;
  local_c40 = ZEXT816(0);
  auVar19 = ZEXT1632(local_c40);
  uVar17 = 0;
  uVar18 = 0;
  init_qp((int16_t *)in_stack_fffffffffffff410,in_stack_fffffffffffff408,in_stack_fffffffffffff400,
          in_stack_fffffffffffff3fc,in_stack_fffffffffffff3f0,in_stack_fffffffffffff3e8);
  load_coefficients_avx2(in_stack_fffffffffffff3e0);
  auVar14._8_8_ = uVar16;
  auVar14._0_8_ = uVar12;
  auVar14._16_8_ = uVar17;
  auVar14._24_8_ = uVar18;
  auVar14 = vpabsw_avx2(auVar14);
  auVar1._8_8_ = in_stack_fffffffffffff3e8;
  auVar1._0_8_ = in_stack_fffffffffffff3e0;
  auVar1._16_8_ = in_stack_fffffffffffff3f0;
  auVar1._24_4_ = uStack_c08;
  auVar1._28_4_ = in_stack_fffffffffffff3fc;
  auVar1 = vpcmpgtw_avx2(auVar14,auVar1);
  if ((((((((((((((((((((((((((((((((auVar1 >> 7 & (undefined1  [32])0x1) == (undefined1  [32])0x0
                                   && (auVar1 >> 0xf & (undefined1  [32])0x1) ==
                                      (undefined1  [32])0x0) &&
                                  (auVar1 >> 0x17 & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                                 && (auVar1 >> 0x1f & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) &&
                                (auVar1 >> 0x27 & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                               && (auVar1 >> 0x2f & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                              && (auVar1 >> 0x37 & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                             && (auVar1 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                            && (auVar1 >> 0x47 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                           (auVar1 >> 0x4f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (auVar1 >> 0x57 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         (auVar1 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar1 >> 0x67 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       (auVar1 >> 0x6f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar1 >> 0x77 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar1 >> 0x7f,0) == '\0') &&
                    (auVar1 >> 0x87 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   (auVar1 >> 0x8f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar1 >> 0x97 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 (auVar1 >> 0x9f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar1 >> 0xa7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               (auVar1 >> 0xaf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar1 >> 0xb7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar1 >> 0xbf,0) == '\0') &&
            (auVar1 >> 199 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           (auVar1 >> 0xcf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
          (auVar1 >> 0xd7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
         (auVar1 >> 0xdf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
        (auVar1 >> 0xe7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
       (auVar1 >> 0xef & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
      (auVar1 >> 0xf7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) && -1 < auVar1[0x1f]) {
    auVar13 = auVar1._0_16_;
    write_zero((tran_low_t *)0x0);
    write_zero((tran_low_t *)0x0);
  }
  else {
    auVar5._8_8_ = in_stack_fffffffffffff408;
    auVar5._0_8_ = in_stack_fffffffffffff400;
    auVar5._16_8_ = in_stack_fffffffffffff410;
    auVar5._24_8_ = in_stack_fffffffffffff418[0];
    unique0x10002730 = in_stack_fffffffffffff418[1];
    unique0x10002738 = in_stack_fffffffffffff418[2];
    unique0x10002740 = in_stack_fffffffffffff418[3];
    auVar14 = vpaddsw_avx2(auVar14,auVar5);
    auVar7._8_8_ = lVar21;
    auVar7._0_8_ = lVar20;
    auVar7._16_8_ = lVar22;
    auVar7._24_8_ = uStack_bc8;
    auVar14 = vpmulhuw_avx2(auVar14,auVar7);
    auVar3._8_8_ = uVar16;
    auVar3._0_8_ = uVar12;
    auVar3._16_8_ = uVar17;
    auVar3._24_8_ = uVar18;
    vpsignw_avx2(auVar14,auVar3);
    auVar9._8_8_ = uStack_bb8;
    auVar9._0_8_ = local_bc0;
    auVar9._16_8_ = uStack_bb0;
    auVar9._24_8_ = uStack_ba8;
    auVar1 = vpmullw_avx2(auVar14,auVar9);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(1));
    uStack_818 = SUB328(ZEXT832(0),4);
    auVar14 = vpcmpgtw_avx2(auVar14,ZEXT832(uStack_818) << 0x40);
    auVar2._8_8_ = uVar16;
    auVar2._0_8_ = uVar12;
    auVar2._16_8_ = uVar17;
    auVar2._24_8_ = uVar18;
    vpsignw_avx2(auVar1,auVar2);
    store_coefficients_avx2(in_stack_fffffffffffff418,in_stack_fffffffffffff410);
    store_coefficients_avx2(in_stack_fffffffffffff418,in_stack_fffffffffffff410);
    auVar1 = vpermq_avx2(*(undefined1 (*) [32])scan_ptr,0xd8);
    auVar1 = vpsubw_avx2(auVar1,auVar14);
    auVar14 = vpand_avx2(auVar1,auVar14);
    auVar19 = vpmaxsw_avx2(auVar19,auVar14);
    auVar13 = auVar19._0_16_;
  }
  in_stack_00000008 = in_stack_00000008 + 0x40;
  scan_ptr = scan_ptr + 0x10;
  auVar15 = ZEXT1664(auVar13);
  update_qp((__m256i *)&stack0xfffffffffffff3e0,(__m256i *)&stack0xfffffffffffff400);
  for (local_b70 = in_RSI + -0x10; auVar14 = auVar15._0_32_, 0 < local_b70;
      local_b70 = local_b70 + -0x10) {
    load_coefficients_avx2(in_stack_fffffffffffff3e0);
    auVar1 = vpabsw_avx2(auVar14);
    auVar4._8_8_ = in_stack_fffffffffffff3e8;
    auVar4._0_8_ = in_stack_fffffffffffff3e0;
    auVar4._16_8_ = in_stack_fffffffffffff3f0;
    auVar4._24_4_ = uStack_c08;
    auVar4._28_4_ = in_stack_fffffffffffff3fc;
    auVar2 = vpcmpgtw_avx2(auVar1,auVar4);
    if ((((((((((((((((((((((((((((((((auVar2 >> 7 & (undefined1  [32])0x1) == (undefined1  [32])0x0
                                     && (auVar2 >> 0xf & (undefined1  [32])0x1) ==
                                        (undefined1  [32])0x0) &&
                                    (auVar2 >> 0x17 & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) &&
                                   (auVar2 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                                   ) && (auVar2 >> 0x27 & (undefined1  [32])0x1) ==
                                        (undefined1  [32])0x0) &&
                                 (auVar2 >> 0x2f & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                                && (auVar2 >> 0x37 & (undefined1  [32])0x1) == (undefined1  [32])0x0
                                ) && (auVar2 >> 0x3f & (undefined1  [32])0x1) ==
                                     (undefined1  [32])0x0) &&
                              (auVar2 >> 0x47 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                             (auVar2 >> 0x4f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                            (auVar2 >> 0x57 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                           (auVar2 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (auVar2 >> 0x67 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         (auVar2 >> 0x6f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar2 >> 0x77 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(auVar2 >> 0x7f,0) == '\0') &&
                      (auVar2 >> 0x87 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     (auVar2 >> 0x8f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar2 >> 0x97 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   (auVar2 >> 0x9f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar2 >> 0xa7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 (auVar2 >> 0xaf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar2 >> 0xb7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar2 >> 0xbf,0) == '\0') &&
              (auVar2 >> 199 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             (auVar2 >> 0xcf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar2 >> 0xd7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           (auVar2 >> 0xdf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
          (auVar2 >> 0xe7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
         (auVar2 >> 0xef & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
        (auVar2 >> 0xf7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) && -1 < auVar2[0x1f]) {
      auVar15 = ZEXT1664(auVar2._0_16_);
      write_zero(auVar19._16_8_);
      write_zero(auVar19._16_8_);
    }
    else {
      auVar6._8_8_ = in_stack_fffffffffffff408;
      auVar6._0_8_ = in_stack_fffffffffffff400;
      auVar6._16_8_ = in_stack_fffffffffffff410;
      auVar6._24_8_ = in_stack_fffffffffffff418[0];
      unique0x10002778 = in_stack_fffffffffffff418[1];
      unique0x10002780 = in_stack_fffffffffffff418[2];
      unique0x10002788 = in_stack_fffffffffffff418[3];
      auVar1 = vpaddsw_avx2(auVar1,auVar6);
      auVar8._8_8_ = lVar21;
      auVar8._0_8_ = lVar20;
      auVar8._16_8_ = lVar22;
      auVar8._24_8_ = uStack_bc8;
      auVar1 = vpmulhuw_avx2(auVar1,auVar8);
      vpsignw_avx2(auVar1,auVar14);
      auVar10._8_8_ = uStack_bb8;
      auVar10._0_8_ = local_bc0;
      auVar10._16_8_ = uStack_bb0;
      auVar10._24_8_ = uStack_ba8;
      auVar2 = vpmullw_avx2(auVar1,auVar10);
      auVar2 = vpsrlw_avx2(auVar2,ZEXT416(1));
      uStack_9b8 = SUB328(ZEXT832(0),4);
      auVar1 = vpcmpgtw_avx2(auVar1,ZEXT832(uStack_9b8) << 0x40);
      vpsignw_avx2(auVar2,auVar14);
      store_coefficients_avx2(in_stack_fffffffffffff418,in_stack_fffffffffffff410);
      store_coefficients_avx2(in_stack_fffffffffffff418,in_stack_fffffffffffff410);
      auVar14 = vpermq_avx2(*(undefined1 (*) [32])scan_ptr,0xd8);
      auVar14 = vpsubw_avx2(auVar14,auVar1);
      auVar14 = vpand_avx2(auVar14,auVar1);
      auVar19 = vpmaxsw_avx2(auVar19,auVar14);
      auVar15 = ZEXT3264(auVar19);
    }
    in_stack_00000008 = in_stack_00000008 + 0x40;
    scan_ptr = scan_ptr + 0x10;
  }
  eob[1] = (longlong)in_stack_fffffffffffff3e0;
  eob[0] = auVar19._24_8_;
  eob[2] = (longlong)in_stack_fffffffffffff3e8;
  eob[3] = (longlong)in_stack_fffffffffffff3f0;
  uVar11 = quant_gather_eob(eob);
  *dequant_ptr = uVar11;
  return;
}

Assistant:

void av1_quantize_fp_32x32_avx2(
    const tran_low_t *coeff_ptr, intptr_t n_coeffs, const int16_t *zbin_ptr,
    const int16_t *round_ptr, const int16_t *quant_ptr,
    const int16_t *quant_shift_ptr, tran_low_t *qcoeff_ptr,
    tran_low_t *dqcoeff_ptr, const int16_t *dequant_ptr, uint16_t *eob_ptr,
    const int16_t *scan_ptr, const int16_t *iscan_ptr) {
  (void)scan_ptr;
  (void)zbin_ptr;
  (void)quant_shift_ptr;

  const int log_scale = 1;
  const unsigned int step = 16;
  __m256i qp[3], thr;
  __m256i eob = _mm256_setzero_si256();

  init_qp(round_ptr, quant_ptr, dequant_ptr, log_scale, &thr, qp);

  quantize_fp_32x32(&thr, qp, coeff_ptr, iscan_ptr, qcoeff_ptr, dqcoeff_ptr,
                    &eob);

  coeff_ptr += step;
  qcoeff_ptr += step;
  dqcoeff_ptr += step;
  iscan_ptr += step;
  n_coeffs -= step;

  update_qp(&thr, qp);

  while (n_coeffs > 0) {
    quantize_fp_32x32(&thr, qp, coeff_ptr, iscan_ptr, qcoeff_ptr, dqcoeff_ptr,
                      &eob);

    coeff_ptr += step;
    qcoeff_ptr += step;
    dqcoeff_ptr += step;
    iscan_ptr += step;
    n_coeffs -= step;
  }
  *eob_ptr = quant_gather_eob(eob);
}